

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t zeDeviceGetStatus(ze_device_handle_t hDevice)

{
  ze_pfnDeviceGetStatus_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnDeviceGetStatus_t pfnGetStatus;
  ze_device_handle_t hDevice_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->Device).pfnGetStatus;
    if (p_Var1 == (ze_pfnDeviceGetStatus_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDevice_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDevice_local._4_4_ = (*p_Var1)(hDevice);
    }
  }
  else {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDevice_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeDeviceGetStatus(
    ze_device_handle_t hDevice                      ///< [in] handle of the device
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnDeviceGetStatus_t pfnGetStatus = [&result] {
        auto pfnGetStatus = ze_lib::context->zeDdiTable.load()->Device.pfnGetStatus;
        if( nullptr == pfnGetStatus ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetStatus;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetStatus( hDevice );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetStatus = ze_lib::context->zeDdiTable.load()->Device.pfnGetStatus;
    if( nullptr == pfnGetStatus ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetStatus( hDevice );
    #endif
}